

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_data_dictionary_init(void)

{
  long *plVar1;
  coda_data_dictionary *pcVar2;
  undefined8 *puVar3;
  int local_c;
  
  plVar1 = (long *)__tls_get_addr(&PTR_00246f50);
  if (*plVar1 == 0) {
    pcVar2 = coda_data_dictionary_new();
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_00246f50);
    *puVar3 = pcVar2;
    plVar1 = (long *)__tls_get_addr(&PTR_00246f50);
    if (*plVar1 == 0) {
      local_c = -1;
    }
    else {
      local_c = 0;
    }
    return local_c;
  }
  __assert_fail("coda_global_data_dictionary == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0x4b0,"int coda_data_dictionary_init(void)");
}

Assistant:

int coda_data_dictionary_init(void)
{
    assert(coda_global_data_dictionary == NULL);

    coda_global_data_dictionary = coda_data_dictionary_new();
    if (coda_global_data_dictionary == NULL)
    {
        return -1;
    }

    return 0;
}